

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O0

OLECHAR __thiscall
UTF8EncodingPolicyBase<false>::ReadRest<false>
          (UTF8EncodingPolicyBase<false> *this,OLECHAR ch,EncodedCharPtr *p,EncodedCharPtr last)

{
  char16 cVar1;
  OLECHAR result;
  EncodedCharPtr s;
  EncodedCharPtr last_local;
  EncodedCharPtr *p_local;
  OLECHAR ch_local;
  UTF8EncodingPolicyBase<false> *this_local;
  
  cVar1 = utf8::DecodeTail(ch,p,last,&this->m_decodeOptions,(bool *)0x0);
  return cVar1;
}

Assistant:

OLECHAR ReadRest(OLECHAR ch, EncodedCharPtr &p, EncodedCharPtr last)
    {
        EncodedCharPtr s;
        if (bScan)
        {
            s = p;
        }
        OLECHAR result = utf8::DecodeTail(ch, p, last, m_decodeOptions);
        if (bScan)
        {
            // If we are scanning, update m_cMultiUnits counter.
            m_cMultiUnits += p - s;
        }
        return result;
    }